

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDColor.cpp
# Opt level: O1

void __thiscall EDColor::ComputeGradientMapByDiZenzo(EDColor *this)

{
  uchar *puVar1;
  uchar *puVar2;
  short *psVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  double dVar23;
  double __x;
  int local_70;
  int local_6c;
  
  local_6c = 0;
  memset(this->gradImg,0,(long)this->height * (long)this->width * 2);
  iVar8 = this->height;
  dVar23 = 0.0;
  if (2 < iVar8) {
    iVar19 = 1;
    local_70 = 2;
    iVar15 = 0;
    do {
      iVar8 = this->width;
      if (2 < iVar8) {
        lVar21 = 1;
        iVar6 = iVar15;
        do {
          iVar7 = local_70 * iVar8;
          iVar15 = (int)lVar21;
          iVar9 = iVar15 + iVar7 + 1;
          puVar1 = this->smooth_L;
          puVar2 = this->smooth_a;
          iVar22 = local_6c * iVar8;
          iVar10 = iVar15 + iVar22 + -1;
          iVar11 = iVar15 + iVar22 + 1;
          iVar12 = iVar15 + -1 + iVar7;
          iVar13 = iVar15 + iVar8 * iVar19 + 1;
          iVar15 = iVar15 + -1 + iVar8 * iVar19;
          iVar20 = ((uint)puVar1[iVar13] - (uint)puVar1[iVar15]) +
                   ((uint)puVar1[iVar9] - (uint)puVar1[iVar10]) +
                   ((uint)puVar1[iVar11] - (uint)puVar1[iVar12]);
          iVar8 = ((uint)puVar1[lVar21 + iVar7] - (uint)puVar1[lVar21 + iVar22]) +
                  (((uint)puVar1[iVar9] - (uint)puVar1[iVar10]) -
                  ((uint)puVar1[iVar11] - (uint)puVar1[iVar12]));
          iVar18 = ((uint)puVar2[iVar13] - (uint)puVar2[iVar15]) +
                   ((uint)puVar2[iVar11] - (uint)puVar2[iVar12]) +
                   ((uint)puVar2[iVar9] - (uint)puVar2[iVar10]);
          iVar16 = ((uint)puVar2[lVar21 + iVar7] - (uint)puVar2[lVar21 + iVar22]) +
                   (((uint)puVar2[iVar9] - (uint)puVar2[iVar10]) -
                   ((uint)puVar2[iVar11] - (uint)puVar2[iVar12]));
          puVar1 = this->smooth_b;
          iVar13 = ((uint)puVar1[iVar13] - (uint)puVar1[iVar15]) +
                   ((uint)puVar1[iVar11] - (uint)puVar1[iVar12]) +
                   ((uint)puVar1[iVar9] - (uint)puVar1[iVar10]);
          iVar7 = ((uint)puVar1[lVar21 + iVar7] - (uint)puVar1[lVar21 + iVar22]) +
                  (((uint)puVar1[iVar9] - (uint)puVar1[iVar10]) -
                  ((uint)puVar1[iVar11] - (uint)puVar1[iVar12]));
          iVar9 = iVar13 * iVar13 + iVar18 * iVar18 + iVar20 * iVar20;
          iVar15 = iVar7 * iVar7 + iVar16 * iVar16 + iVar8 * iVar8;
          __x = (double)(iVar9 - iVar15);
          iVar8 = iVar7 * iVar13 + iVar16 * iVar18 + iVar8 * iVar20;
          dVar23 = (double)iVar8;
          dVar23 = atan2(dVar23 + dVar23,__x);
          dVar23 = dVar23 * 0.5;
          dVar4 = cos(dVar23 + dVar23);
          dVar5 = sin(dVar23 + dVar23);
          dVar4 = (dVar5 * (double)(iVar8 * 2) + dVar4 * __x + (double)(iVar15 + iVar9)) * 0.5;
          if (dVar4 < 0.0) {
            dVar4 = sqrt(dVar4);
          }
          else {
            dVar4 = SQRT(dVar4);
          }
          iVar15 = (int)(dVar4 + 0.5);
          this->dirImg[lVar21 + (long)this->width * (long)iVar19] =
               (0.7853975 < ABS(dVar23)) + '\x01';
          this->gradImg[(long)this->width * (long)iVar19 + lVar21] = (short)iVar15;
          if (iVar15 < iVar6) {
            iVar15 = iVar6;
          }
          iVar8 = this->width;
          lVar21 = lVar21 + 1;
          iVar6 = iVar15;
        } while ((int)lVar21 < iVar8 + -1);
      }
      iVar19 = iVar19 + 1;
      iVar8 = this->height;
      local_6c = local_6c + 1;
      local_70 = local_70 + 1;
    } while (iVar19 < iVar8 + -1);
    dVar23 = (double)iVar15;
  }
  uVar14 = iVar8 * this->width;
  if (0 < (int)uVar14) {
    psVar3 = this->gradImg;
    uVar17 = 0;
    do {
      psVar3[uVar17] = (short)(int)((double)(int)psVar3[uVar17] * (255.0 / dVar23));
      uVar17 = uVar17 + 1;
    } while (uVar14 != uVar17);
  }
  return;
}

Assistant:

void EDColor::ComputeGradientMapByDiZenzo()
{
	memset(gradImg, 0, sizeof(short)*width*height);

	int max = 0;

	for (int i = 1; i < height - 1; i++) {
		for (int j = 1; j < width - 1; j++) {
#if 1
			// Prewitt for channel1
			int com1 = smooth_L[(i + 1)*width + j + 1] - smooth_L[(i - 1)*width + j - 1];
			int com2 = smooth_L[(i - 1)*width + j + 1] - smooth_L[(i + 1)*width + j - 1];

			int gxCh1 = com1 + com2 + (smooth_L[i*width + j + 1] - smooth_L[i*width + j - 1]);
			int gyCh1 = com1 - com2 + (smooth_L[(i + 1)*width + j] - smooth_L[(i - 1)*width + j]);

			// Prewitt for channel2
			com1 = smooth_a[(i + 1)*width + j + 1] - smooth_a[(i - 1)*width + j - 1];
			com2 = smooth_a[(i - 1)*width + j + 1] - smooth_a[(i + 1)*width + j - 1];

			int gxCh2 = com1 + com2 + (smooth_a[i*width + j + 1] - smooth_a[i*width + j - 1]);
			int gyCh2 = com1 - com2 + (smooth_a[(i + 1)*width + j] - smooth_a[(i - 1)*width + j]);

			// Prewitt for channel3
			com1 = smooth_b[(i + 1)*width + j + 1] - smooth_b[(i - 1)*width + j - 1];
			com2 = smooth_b[(i - 1)*width + j + 1] - smooth_b[(i + 1)*width + j - 1];

			int gxCh3 = com1 + com2 + (smooth_b[i*width + j + 1] - smooth_b[i*width + j - 1]);
			int gyCh3 = com1 - com2 + (smooth_b[(i + 1)*width + j] - smooth_b[(i - 1)*width + j]);
#else
			// Sobel for channel1
			int com1 = smooth_L[(i + 1)*width + j + 1] - smooth_L[(i - 1)*width + j - 1];
			int com2 = smooth_L[(i - 1)*width + j + 1] - smooth_L[(i + 1)*width + j - 1];

			int gxCh1 = com1 + com2 + 2 * (smooth_L[i*width + j + 1] - smooth_L[i*width + j - 1]);
			int gyCh1 = com1 - com2 + 2 * (smooth_L[(i + 1)*width + j] - smooth_L[(i - 1)*width + j]);

			// Sobel for channel2
			com1 = smooth_a[(i + 1)*width + j + 1] - smooth_a[(i - 1)*width + j - 1];
			com2 = smooth_a[(i - 1)*width + j + 1] - smooth_a[(i + 1)*width + j - 1];

			int gxCh2 = com1 + com2 + 2 * (smooth_a[i*width + j + 1] - smooth_a[i*width + j - 1]);
			int gyCh2 = com1 - com2 + 2 * (smooth_a[(i + 1)*width + j] - smooth_a[(i - 1)*width + j]);

			// Sobel for channel3
			com1 = smooth_b[(i + 1)*width + j + 1] - smooth_b[(i - 1)*width + j - 1];
			com2 = smooth_b[(i - 1)*width + j + 1] - smooth_b[(i + 1)*width + j - 1];

			int gxCh3 = com1 + com2 + 2 * (smooth_b[i*width + j + 1] - smooth_b[i*width + j - 1]);
			int gyCh3 = com1 - com2 + 2 * (smooth_b[(i + 1)*width + j] - smooth_b[(i - 1)*width + j]);
#endif
			int gxx = gxCh1*gxCh1 + gxCh2*gxCh2 + gxCh3*gxCh3;
			int gyy = gyCh1*gyCh1 + gyCh2*gyCh2 + gyCh3*gyCh3;
			int gxy = gxCh1*gyCh1 + gxCh2*gyCh2 + gxCh3*gyCh3;

#if 1
			// Di Zenzo's formulas from Gonzales & Woods - Page 337
			double theta = atan2(2.0*gxy, (double)(gxx - gyy)) / 2; // Gradient Direction
			int grad = (int)(sqrt(((gxx + gyy) + (gxx - gyy)*cos(2 * theta) + 2 * gxy*sin(2 * theta)) / 2.0) + 0.5); // Gradient Magnitude
#else
			// Koschan & Abidi - 2005 - Signal Processing Magazine
			double theta = atan2(2.0*gxy, (double)(gxx - gyy)) / 2; // Gradient Direction

			double cosTheta = cos(theta);
			double sinTheta = sin(theta);
			int grad = (int)(sqrt(gxx*cosTheta*cosTheta + 2 * gxy*sinTheta*cosTheta + gyy*sinTheta*sinTheta) + 0.5); // Gradient Magnitude
#endif

			// Gradient is perpendicular to the edge passing through the pixel	
			if (theta >= -3.14159 / 4 && theta <= 3.14159 / 4)
				dirImg[i*width + j] = EDGE_VERTICAL;
			else
				dirImg[i*width + j] = EDGE_HORIZONTAL;

			gradImg[i*width + j] = grad;
			if (grad > max) max = grad;

		}
	} // end outer for

	// Scale the gradient values to 0-255
	double scale = 255.0 / max;
	for (int i = 0; i<width*height; i++)
		gradImg[i] = (short)(gradImg[i] * scale);
}